

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O1

int __thiscall ConditionalEstimator::init(ConditionalEstimator *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  double **ppdVar2;
  uint in_EAX;
  void *pvVar3;
  long lVar4;
  size_t __n;
  ulong uVar5;
  int iVar6;
  
  this->bRejection = false;
  (this->super_Estimator).nSamples = 0;
  uVar1 = (this->super_Estimator).nEstimate;
  if ((uVar1 & 4) != 0) {
    in_EAX = this->nPre;
    if (-1 < (int)(this->nPost + in_EAX)) {
      pvVar3 = memset(this->aOne,0,(ulong)(in_EAX + this->nPost + 1) << 3);
      in_EAX = (uint)pvVar3;
    }
  }
  if ((uVar1 & 0x20) != 0) {
    in_EAX = this->nPre;
    if (-1 < (int)(this->nPost + in_EAX)) {
      pvVar3 = memset(this->aEvents,0,(ulong)(in_EAX + this->nPost + 1) << 3);
      in_EAX = (uint)pvVar3;
    }
  }
  if ((uVar1 & 8) != 0) {
    in_EAX = this->nPre;
    if (-1 < (int)(this->nPost + in_EAX)) {
      pvVar3 = memset(this->aTwo,0,(ulong)(in_EAX + this->nPost + 1) << 3);
      in_EAX = (uint)pvVar3;
    }
  }
  if ((uVar1 & 0x10) != 0) {
    in_EAX = this->nPre;
    if (-1 < (int)(this->nPost + in_EAX)) {
      pvVar3 = memset(this->aThree,0,(ulong)(in_EAX + this->nPost + 1) << 3);
      in_EAX = (uint)pvVar3;
    }
  }
  if ((uVar1 & 2) != 0) {
    in_EAX = this->nPre;
    pvVar3 = (void *)(ulong)in_EAX;
    if (-1 < (int)(this->nPost + in_EAX)) {
      uVar1 = this->nDist;
      ppdVar2 = this->aDist;
      iVar6 = in_EAX + this->nPost;
      uVar5 = 0;
      do {
        if (0 < (int)uVar1) {
          pvVar3 = memset(ppdVar2[uVar5],0,(ulong)uVar1 << 3);
        }
        in_EAX = (uint)pvVar3;
        uVar5 = uVar5 + 1;
      } while (iVar6 + 1 != uVar5);
    }
  }
  (this->condSampleRing).ringIsInitialised = false;
  lVar4 = (long)(this->condSampleRing).ringSize;
  if (0 < lVar4) {
    pvVar3 = memset((this->condSampleRing).ringData,0,lVar4 << 3);
    in_EAX = (uint)pvVar3;
  }
  (this->condSampleRing).ringDelayedAdd = 0.0;
  (this->condSampleRing).ringCacheInvalid = true;
  (this->condSampleRing).ringCurrentIndex = 0;
  (this->condEventRing).ringIsInitialised = false;
  __n = (size_t)(this->condEventRing).ringSize;
  if (0 < (long)__n) {
    pvVar3 = memset((this->condEventRing).ringData,0,__n);
    in_EAX = (uint)pvVar3;
  }
  (this->condEventRing).ringDelayedAdd = false;
  (this->condEventRing).ringCacheInvalid = true;
  (this->condEventRing).ringCurrentIndex = 0;
  return in_EAX;
}

Assistant:

void ConditionalEstimator::init()
{
	bRejection = false;
	nSamples = 0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<nPre+nPost+1; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_EVENTS)
		for(int i=0; i<nPre+nPost+1; i++)
			aEvents[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<nPre+nPost+1; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<nPre+nPost+1; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		for( int i=0; i<nPre+nPost+1; i++ )
			for( int j=0; j<nDist; j++ )
				aDist[i][j] = 0.0;
	}
	condSampleRing.clear();
	condEventRing.clear();
}